

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test10::logVariableType
          (GPUShaderFP64Test10 *this,GLvoid *buffer,GLchar *name,_variable_type type)

{
  _variable_type _Var1;
  uint uVar2;
  size_t sVar3;
  TestError *this_00;
  _variable_type type_00;
  ulong uVar4;
  MessageBuilder message;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  _Var1 = Utils::getBaseVariableType(type);
  uVar2 = Utils::getNumberOfComponentsForVariableType(type);
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (name == (GLchar *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," (",2);
  Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)type,type_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  uVar4 = 0;
  do {
    if (uVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    }
    if (_Var1 == VARIABLE_TYPE_UINT) {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    }
    else if (_Var1 == VARIABLE_TYPE_INT) {
      std::ostream::operator<<((ostringstream *)&local_1a8,*(int *)((long)buffer + uVar4 * 4));
    }
    else {
      if (_Var1 != VARIABLE_TYPE_DOUBLE) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Not implemented",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x3952);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::ostream::_M_insert<double>(*(double *)((long)buffer + uVar4 * 8));
    }
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"]",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GPUShaderFP64Test10::logVariableType(const glw::GLvoid* buffer, const glw::GLchar* name,
										  Utils::_variable_type type) const
{
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);
	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	tcu::MessageBuilder			message		 = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << name << " (" << Utils::getVariableTypeString(type) << ") [";

	for (glw::GLuint component = 0; component < n_components; ++component)
	{
		if (0 != component)
		{
			message << ", ";
		}

		switch (base_type)
		{
		case Utils::VARIABLE_TYPE_DOUBLE:
			message << ((glw::GLdouble*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_INT:
			message << ((glw::GLint*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_UINT:
			message << ((glw::GLuint*)buffer)[component];
			break;
		default:
			TCU_FAIL("Not implemented");
		}
	}

	message << "]" << tcu::TestLog::EndMessage;
}